

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O1

void tidyBufFree(TidyBuffer *buf)

{
  TidyAllocator *pTVar1;
  
  if (buf != (TidyBuffer *)0x0) {
    (*buf->allocator->vtbl->free)(buf->allocator,buf->bp);
    pTVar1 = buf->allocator;
    buf->allocator = (TidyAllocator *)0x0;
    buf->bp = (byte *)0x0;
    buf->size = 0;
    buf->allocated = 0;
    *(undefined8 *)&buf->next = 0;
    if (pTVar1 == (TidyAllocator *)0x0) {
      pTVar1 = &prvTidyg_default_allocator;
    }
    buf->allocator = pTVar1;
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0x56,"void tidyBufFree(TidyBuffer *)");
}

Assistant:

void TIDY_CALL tidyBufFree( TidyBuffer* buf )
{
    assert( buf != NULL );
    TidyFree(  buf->allocator, buf->bp );
    tidyBufInitWithAllocator( buf, buf->allocator );
}